

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

int __thiscall
FFlatVertexBuffer::CreateVertices
          (FFlatVertexBuffer *this,int h,sector_t *sec,secplane_t *plane,int floor)

{
  extsector_t *peVar1;
  sector_t *psVar2;
  extsector_t *peVar3;
  F3DFloor *pFVar4;
  int iVar5;
  ulong uVar6;
  uint g;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  sec->vboheight[h] = sec->planes[h].TexZ;
  iVar5 = CreateSectorVertices(this,sec,plane,floor);
  sec->vboindex[h] = iVar5;
  peVar1 = sec->e;
  for (uVar7 = 0; uVar7 < (peVar1->FakeFloor).Sectors.Count; uVar7 = uVar7 + 1) {
    psVar2 = (peVar1->FakeFloor).Sectors.Array[uVar7];
    iVar5 = CreateSectorVertices(this,psVar2,plane,0);
    psVar2->vboindex[h + 2] = iVar5;
  }
  peVar1 = sec->e;
  uVar7 = 0;
  do {
    if ((peVar1->XFloor).attached.Count <= uVar7) {
      sec->vbocount[h] = (this->vbo_shadowdata).Count - sec->vboindex[h];
      return sec->vboindex[h];
    }
    psVar2 = (peVar1->XFloor).attached.Array[uVar7];
    peVar3 = psVar2->e;
    uVar6 = 0;
    do {
      if ((peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == uVar6)
      goto LAB_0038f6cd;
      pFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar6];
      uVar6 = uVar6 + 1;
    } while (pFVar4->model != sec);
    if ((pFVar4->flags & 8) != 0) {
      if ((pFVar4->top).model == sec) {
        bVar8 = (pFVar4->top).isceiling == h;
      }
      else {
        bVar8 = false;
      }
      if ((pFVar4->bottom).model == sec) {
        bVar9 = (pFVar4->bottom).isceiling == h;
      }
      else {
        bVar9 = false;
      }
      if ((bool)(bVar8 | bVar9)) {
        if (bVar8) {
          (pFVar4->top).vindex = (this->vbo_shadowdata).Count;
        }
        if (bVar9) {
          (pFVar4->bottom).vindex = (this->vbo_shadowdata).Count;
        }
        CreateSectorVertices(this,psVar2,plane,0);
      }
    }
LAB_0038f6cd:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int FFlatVertexBuffer::CreateVertices(int h, sector_t *sec, const secplane_t &plane, int floor)
{
	// First calculate the vertices for the sector itself
	sec->vboheight[h] = sec->GetPlaneTexZ(h);
	sec->vboindex[h] = CreateSectorVertices(sec, plane, floor);

	// Next are all sectors using this one as heightsec
	TArray<sector_t *> &fakes = sec->e->FakeFloor.Sectors;
	for (unsigned g=0; g<fakes.Size(); g++)
	{
		sector_t *fsec = fakes[g];
		fsec->vboindex[2+h] = CreateSectorVertices(fsec, plane, false);
	}

	// and finally all attached 3D floors
	TArray<sector_t *> &xf = sec->e->XFloor.attached;
	for (unsigned g=0; g<xf.Size(); g++)
	{
		sector_t *fsec = xf[g];
		F3DFloor *ffloor = Find3DFloor(fsec, sec);

		if (ffloor != NULL && ffloor->flags & FF_RENDERPLANES)
		{
			bool dotop = (ffloor->top.model == sec) && (ffloor->top.isceiling == h);
			bool dobottom = (ffloor->bottom.model == sec) && (ffloor->bottom.isceiling == h);

			if (dotop || dobottom)
			{
				if (dotop) ffloor->top.vindex = vbo_shadowdata.Size();
				if (dobottom) ffloor->bottom.vindex = vbo_shadowdata.Size();
	
				CreateSectorVertices(fsec, plane, false);
			}
		}
	}
	sec->vbocount[h] = vbo_shadowdata.Size() - sec->vboindex[h];
	return sec->vboindex[h];
}